

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

bool __thiscall chrono::ChOptimizer::PreOptimize(ChOptimizer *this)

{
  int iVar1;
  
  this->user_break = 0;
  this->break_cyclecounter = 0;
  this->err_message[0] = '\0';
  this->fx_evaluations = 0;
  this->grad_evaluations = 0;
  iVar1 = (*this->_vptr_ChOptimizer[7])();
  if (iVar1 < 1) {
    this->error_code = 1;
    builtin_strncpy(this->err_message,"Error: no variables defined",0x1c);
  }
  return 0 < iVar1;
}

Assistant:

bool ChOptimizer::PreOptimize() {
    // reset the counter of number of evaluations.
    fx_evaluations = 0;
    grad_evaluations = 0;

    // reset breakers
    user_break = 0;
    break_cyclecounter = 0;

    // reset error message
    strcpy(err_message, "");

    // check count vars
    int nv = GetNumOfVars();
    if (nv < 1) {
        error_code = OPT_ERR_NOVARS;
        strcpy(err_message, "Error: no variables defined");
        return false;
    }

    return true;
}